

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spinlock_wait.cc
# Opt level: O0

uint32_t absl::lts_20250127::base_internal::SpinLockWait
                   (atomic<unsigned_int> *w,int n,SpinLockWaitTransition *trans,
                   SchedulingMode scheduling_mode)

{
  atomic<unsigned_int> *paVar1;
  __int_type_conflict1 _Var2;
  bool bVar3;
  int local_70;
  __int_type_conflict1 local_6c;
  int i;
  uint32_t v;
  int loop;
  SchedulingMode scheduling_mode_local;
  SpinLockWaitTransition *trans_local;
  atomic<unsigned_int> *paStack_50;
  int n_local;
  atomic<unsigned_int> *w_local;
  memory_order local_40;
  int local_3c;
  memory_order __b;
  undefined1 local_29;
  uint32_t local_28;
  undefined4 local_24;
  undefined4 local_20;
  uint32_t local_1c;
  __int_type_conflict1 *local_18;
  atomic<unsigned_int> *local_10;
  
  i = 0;
  _Var2 = local_6c;
  v = scheduling_mode;
  _loop = trans;
  trans_local._4_4_ = n;
  paStack_50 = w;
LAB_00587980:
  do {
    while( true ) {
      local_6c = _Var2;
      paVar1 = paStack_50;
      ___b = paStack_50;
      local_3c = 2;
      local_40 = std::operator&(memory_order_acquire,__memory_order_mask);
      if (local_3c - 1U < 2) {
        w_local._4_4_ = (paVar1->super___atomic_base<unsigned_int>)._M_i;
      }
      else if (local_3c == 5) {
        w_local._4_4_ = (paVar1->super___atomic_base<unsigned_int>)._M_i;
      }
      else {
        w_local._4_4_ = (paVar1->super___atomic_base<unsigned_int>)._M_i;
      }
      local_6c = w_local._4_4_;
      local_70 = 0;
      while( true ) {
        bVar3 = false;
        if (local_70 != trans_local._4_4_) {
          bVar3 = w_local._4_4_ != _loop[local_70].from;
        }
        if (!bVar3) break;
        local_70 = local_70 + 1;
      }
      if (local_70 != trans_local._4_4_) break;
      i = i + 1;
      SpinLockDelay(paStack_50,w_local._4_4_,i,v);
      _Var2 = local_6c;
    }
    if (_loop[local_70].to != w_local._4_4_) {
      local_28 = _loop[local_70].to;
      local_10 = paStack_50;
      local_18 = &local_6c;
      local_20 = 2;
      local_24 = 0;
      LOCK();
      _Var2 = (paStack_50->super___atomic_base<unsigned_int>)._M_i;
      local_29 = w_local._4_4_ == _Var2;
      if ((bool)local_29) {
        (paStack_50->super___atomic_base<unsigned_int>)._M_i = local_28;
        _Var2 = w_local._4_4_;
      }
      UNLOCK();
      local_1c = local_28;
      if (!(bool)local_29) goto LAB_00587980;
    }
    _Var2 = local_6c;
    if ((_loop[local_70].done & 1U) != 0) {
      return w_local._4_4_;
    }
  } while( true );
}

Assistant:

uint32_t SpinLockWait(std::atomic<uint32_t> *w, int n,
                      const SpinLockWaitTransition trans[],
                      base_internal::SchedulingMode scheduling_mode) {
  int loop = 0;
  for (;;) {
    uint32_t v = w->load(std::memory_order_acquire);
    int i;
    for (i = 0; i != n && v != trans[i].from; i++) {
    }
    if (i == n) {
      SpinLockDelay(w, v, ++loop, scheduling_mode);  // no matching transition
    } else if (trans[i].to == v ||                   // null transition
               w->compare_exchange_strong(v, trans[i].to,
                                          std::memory_order_acquire,
                                          std::memory_order_relaxed)) {
      if (trans[i].done) return v;
    }
  }
}